

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpack_event_reader.hpp
# Opt level: O2

void __thiscall
jsoncons::msgpack::
msgpack_event_reader<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::reset
          (msgpack_event_reader<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> *this
          )

{
  int iVar1;
  
  basic_msgpack_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::reset
            (&this->parser_);
  basic_item_event_receiver<char>::reset(&this->cursor_visitor_);
  this->eof_ = false;
  iVar1 = (*(this->super_basic_staj_event_reader<char>)._vptr_basic_staj_event_reader[3])(this);
  if ((char)iVar1 != '\0') {
    return;
  }
  (*(this->super_basic_staj_event_reader<char>)._vptr_basic_staj_event_reader[7])(this);
  return;
}

Assistant:

void reset()
        {
            parser_.reset();
            cursor_visitor_.reset();
            eof_ = false;
            if (!done())
            {
                next();
            }
        }